

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O2

void __thiscall SceneParser::parseFile(SceneParser *this)

{
  int iVar1;
  Group *pGVar2;
  undefined8 extraout_RAX;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char token [100];
  
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          iVar1 = getToken(this,token);
          if (iVar1 == 0) {
            return;
          }
          iVar1 = bcmp(token,"PerspectiveCamera",0x12);
          if (iVar1 != 0) break;
          parsePerspectiveCamera(this);
        }
        iVar1 = bcmp(token,"Background",0xb);
        if (iVar1 != 0) break;
        parseBackground(this);
      }
      iVar1 = bcmp(token,"Materials",10);
      if (iVar1 != 0) break;
      parseMaterials(this);
    }
    iVar1 = bcmp(token,"Group",6);
    if (iVar1 != 0) break;
    pGVar2 = parseGroup(this);
    this->_group = pGVar2;
  }
  std::__cxx11::string::string((string *)&local_b8,"Unknown token in parseFile: \'",&local_f9);
  std::operator+(&local_f8,&local_b8,token);
  std::operator+(&local_d8,&local_f8,"\'\n");
  _PostError(&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_b8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
SceneParser::parseFile() {
    // At the top level, the scene can have a camera,
    // background color and a group of objects.
    char token[MAX_PARSER_TOKEN_LENGTH];
    while (getToken(token)) {
        if (!strcmp(token, "PerspectiveCamera")) {
            parsePerspectiveCamera();
        } else if (!strcmp(token, "Background")) {
            parseBackground();
        } else if (!strcmp(token, "Materials")) {
            parseMaterials();
        } else if (!strcmp(token, "Group")) {
            _group = parseGroup();
        } else {
            _PostError(
                    std::string("Unknown token in parseFile: '") + token + "'\n");
            exit(1);
        }
    }
}